

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O2

void __thiscall xmrig::CudaBackend::tick(CudaBackend *this,uint64_t ticks)

{
  uint32_t uVar1;
  Config *this_00;
  
  Workers<xmrig::CudaLaunchData>::tick(&this->d_ptr->workers,ticks);
  this_00 = Base::config(&this->d_ptr->controller->super_Base);
  uVar1 = Config::healthPrintTime(this_00);
  if (((ticks != 0) && (uVar1 != 0)) && (ticks % (ulong)(uVar1 * 2) == 0)) {
    CudaBackendPrivate::printHealth(this->d_ptr);
    return;
  }
  return;
}

Assistant:

void xmrig::CudaBackend::tick(uint64_t ticks)
{
    d_ptr->workers.tick(ticks);

#   ifdef XMRIG_FEATURE_NVML
    auto seconds = d_ptr->controller->config()->healthPrintTime();
    if (seconds && ticks && (ticks % (seconds * 2)) == 0) {
        d_ptr->printHealth();
    }
#   endif
}